

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.cpp
# Opt level: O2

void __thiscall
ObjectExpression::putFunction
          (ObjectExpression *this,Identifier *ident,Scope scope,ptr<Function> *function)

{
  __shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Symbol symbol;
  Identifier local_70;
  Symbol local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)ident);
  Symbol::Symbol(&local_50,&local_70,false,scope);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Function>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Function>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Function>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Function>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->functionMap,&local_50)->
             super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&function->super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>);
  Symbol::~Symbol(&local_50);
  return;
}

Assistant:

void ObjectExpression::putFunction(const Identifier &ident, Scope scope, ptr<Function> function) {
    Symbol symbol(ident, false, scope);
    functionMap[symbol] = std::move(function);
}